

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool ctemplate::Template::ParseDelimiters(char *text,size_t textlen,MarkerDelimiters *delim)

{
  void *pvVar1;
  void *pvVar2;
  char *space;
  MarkerDelimiters *delim_local;
  size_t textlen_local;
  char *text_local;
  
  pvVar1 = memchr(text,0x20,textlen);
  if ((((2 < textlen) && (*text == '=')) && (text[textlen - 1] == '=')) &&
     (((pvVar2 = memchr(text + 1,0x3d,textlen - 2), pvVar2 == (void *)0x0 && (pvVar1 != (void *)0x0)
       ) && (pvVar2 = memchr((void *)((long)pvVar1 + 1),0x20,
                             (size_t)(text + (textlen - ((long)pvVar1 + 1)))), pvVar2 == (void *)0x0
            )))) {
    delim->start_marker = text + 1;
    delim->start_marker_len = (long)pvVar1 - (long)delim->start_marker;
    delim->end_marker = (char *)((long)pvVar1 + 1);
    delim->end_marker_len = (size_t)(text + ((textlen - 1) - (long)delim->end_marker));
    return true;
  }
  return false;
}

Assistant:

bool Template::ParseDelimiters(const char* text, size_t textlen,
                               MarkerDelimiters* delim) {
  const char* space = (const char*)memchr(text, ' ', textlen);
  if (textlen < 3 ||
      text[0] != '=' || text[textlen - 1] != '=' ||        // no = at ends
      memchr(text + 1, '=', textlen - 2) ||                // = in the middle
      !space ||                                            // no interior space
      memchr(space + 1, ' ', text + textlen - (space+1)))  // too many spaces
    return false;

  delim->start_marker = text + 1;
  delim->start_marker_len = space - delim->start_marker;
  delim->end_marker = space + 1;
  delim->end_marker_len = text + textlen - 1 - delim->end_marker;
  return true;
}